

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  SymbolTableListTraits<llvm::Function> *this;
  pointer *pppFVar1;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *ArgsTy_00;
  uint *puVar2;
  pointer *ppWVar3;
  SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_> *pSVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  pointer ppFVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  __pid_t _Var11;
  __pid_t _Var12;
  undefined8 *puVar13;
  Module *pMVar14;
  FunctionType *pFVar15;
  IRBuilderBase *pIVar16;
  LLVMContext *pLVar17;
  LoadInst *a;
  ulong uVar18;
  Value *pVVar19;
  Type *pTVar20;
  BasicBlock *pBVar21;
  Function *pFVar22;
  ulong uVar23;
  Function *pFVar24;
  Twine *pTVar25;
  ValueHandleBase *this_00;
  Function *pFVar26;
  SymbolTableListTraits<llvm::Function> *pSVar27;
  Pass *pPVar28;
  ostream *poVar29;
  long *plVar30;
  raw_ostream *prVar31;
  uint uVar32;
  long *plVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  char *pcVar35;
  uint uVar36;
  pointer ppTVar37;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *ArgsTy_01;
  Function *pFVar38;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *ArgsTy_02;
  uint uVar39;
  Argument *A;
  long lVar40;
  undefined1 auVar41 [8];
  byte bVar42;
  IRBuilderBase *this_01;
  pointer ppFVar43;
  Function *pFVar44;
  BranchInst **bi;
  long lVar45;
  uint __len;
  Function *pFVar46;
  Module *pMVar47;
  StringRef T;
  StringRef SVar48;
  StringRef Str;
  StringRef Str_00;
  iterator_range<llvm::Argument_*> iVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [12];
  uint in_stack_fffffffffffffcfc;
  PrettyStackTraceProgram in_stack_fffffffffffffd00;
  PrettyStackTraceProgram X;
  undefined1 local_2e0 [8];
  ValueToValueMapTy VMap;
  ios_base local_260 [264];
  undefined1 local_158 [8];
  string SStr;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> ArgsTy;
  long *local_f8;
  undefined1 auStack_e8 [8];
  vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_> InstToDelete;
  int local_c8;
  int local_c4;
  int p [2];
  PassManager Passes;
  undefined1 auStack_a8 [8];
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> RealArgsTy;
  pointer *pppFStack_78;
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> Funcs;
  undefined1 local_50 [8];
  int Budget;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  llvm::PrettyStackTraceProgram::PrettyStackTraceProgram
            ((PrettyStackTraceProgram *)&stack0xfffffffffffffd00,argc,argv);
  llvm::cl::ParseCommandLineOptions
            ((cl *)(ulong)(uint)argc,(int)argv,(char **)"llvm codegen stress-tester\n",
             (StringRef)ZEXT816(0x1b),(raw_ostream *)0x0,
             (char *)((ulong)in_stack_fffffffffffffcfc << 0x20),(bool)in_stack_fffffffffffffd00);
  if ((int)(anonymous_namespace)::W._128_4_ < 2) {
    pcVar35 = "Width must be >= 2";
LAB_0026007d:
    anon_unknown.dwarf_23be6::die(pcVar35);
  }
  puVar13 = (undefined8 *)mmap((void *)0x0,0x1498,3,0x21,-1,0);
  (anonymous_namespace)::Shmem = puVar13;
  if (puVar13 == (undefined8 *)0xffffffffffffffff) {
    pcVar35 = "mmap failed";
    goto LAB_0026007d;
  }
  LOCK();
  *puVar13 = 1;
  UNLOCK();
  *(undefined4 *)((long)puVar13 + 0x148c) = 1;
  iVar10 = pthread_mutexattr_init((pthread_mutexattr_t *)(puVar13 + 6));
  if (iVar10 != 0) {
    pcVar35 = "pthread_mutexattr_init failed";
    goto LAB_0026007d;
  }
  iVar10 = pthread_mutexattr_setpshared((pthread_mutexattr_t *)((anonymous_namespace)::Shmem + 6),1)
  ;
  if (iVar10 != 0) {
    pcVar35 = "pthread_mutexattr_setpshared failed";
    goto LAB_0026007d;
  }
  iVar10 = pthread_mutex_init((pthread_mutex_t *)((anonymous_namespace)::Shmem + 1),
                              (pthread_mutexattr_t *)((anonymous_namespace)::Shmem + 6));
  if (iVar10 != 0) {
    pcVar35 = "pthread_mutex_init failed";
    goto LAB_0026007d;
  }
  iVar10 = pthread_condattr_init((pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291));
  if (iVar10 != 0) {
    pcVar35 = "pthread_condattr_init failed";
    goto LAB_0026007d;
  }
  iVar10 = pthread_condattr_setpshared
                     ((pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291),1);
  if (iVar10 != 0) {
    pcVar35 = "pthread_condattr_setpshared failed";
    goto LAB_0026007d;
  }
  lVar40 = 0x38;
  lVar45 = 0;
  puVar13 = (anonymous_namespace)::Shmem;
  do {
    iVar10 = pthread_cond_init((pthread_cond_t *)((long)puVar13 + lVar40),
                               (pthread_condattr_t *)(puVar13 + 0x291));
    puVar13 = (anonymous_namespace)::Shmem;
    if (iVar10 != 0) {
      anon_unknown.dwarf_23be6::die("pthread_cond_init failed");
    }
    *(undefined4 *)((long)(anonymous_namespace)::Shmem + lVar45 * 4 + 0x12f8) = 0;
    lVar45 = lVar45 + 1;
    lVar40 = lVar40 + 0x30;
  } while (lVar45 != 100);
  (anonymous_namespace)::Init = 1;
  _Var11 = getpid();
  iVar10 = atexit(anon_unknown.dwarf_23be6::decrease_runners);
  if (iVar10 != 0) {
    pcVar35 = "atexit failed";
LAB_00260092:
    anon_unknown.dwarf_23be6::die(pcVar35);
  }
  iVar10 = pipe(&local_c8);
  if (iVar10 != 0) {
    pcVar35 = "pipe failed??";
    goto LAB_00260092;
  }
  pMVar14 = (Module *)operator_new(800);
  llvm::Module::Module
            (pMVar14,(StringRef)ZEXT816(0x8145da),(LLVMContext *)&(anonymous_namespace)::C);
  (anonymous_namespace)::M = pMVar14;
  if ((anonymous_namespace)::ARM64[0x80] == '\x01') {
    T.Length = 0x19;
    T.Data = "aarch64-unknown-linux-gnu";
    llvm::Module::setTargetTriple(pMVar14,T);
    SVar48.Length = 0x33;
    SVar48.Data = "e-m:e-i8:8:32-i16:16:32-i64:64-i128:128-n32:64-S128";
    llvm::Module::setDataLayout((anonymous_namespace)::M,SVar48);
  }
  SStr.field_2._8_8_ = 0;
  RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (-2 < (int)(anonymous_namespace)::N._128_4_) {
    iVar10 = -1;
    ArgsTy_00 = (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
                (&SStr.field_2._M_allocated_capacity + 1);
    do {
      anon_unknown.dwarf_23be6::makeArg
                ((anonymous_namespace)::W._128_4_,ArgsTy_00,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_a8);
      anon_unknown.dwarf_23be6::makeArg
                ((anonymous_namespace)::W._128_4_,ArgsTy_00,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_a8);
      anon_unknown.dwarf_23be6::makeArg
                (1,ArgsTy_00,(vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_a8);
      anon_unknown.dwarf_23be6::makeArg
                ((int)(anonymous_namespace)::W._128_4_ / 2,ArgsTy_00,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_a8);
      anon_unknown.dwarf_23be6::makeArg
                ((anonymous_namespace)::W._128_4_ * 2,ArgsTy_00,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_a8);
      iVar10 = iVar10 + 1;
    } while (iVar10 <= (int)(anonymous_namespace)::N._128_4_);
  }
  uVar39 = 1;
  if ((anonymous_namespace)::Geni1[0x80] == '\0') {
    uVar39 = (anonymous_namespace)::W._128_4_;
  }
  uVar36 = uVar39;
  if ((int)uVar39 < (int)(anonymous_namespace)::Promote._128_4_) {
    uVar36 = (anonymous_namespace)::Promote._128_4_;
  }
  if ((anonymous_namespace)::Promote._128_4_ == -1) {
    uVar36 = uVar39;
  }
  pFVar15 = (FunctionType *)llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,uVar36);
  ppTVar37 = RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  auVar41 = auStack_a8;
  if ((anonymous_namespace)::ArgsFromMem[0x80] != '\0') {
    ppTVar37 = (pointer)0x0;
    auVar41 = (undefined1  [8])(Twine *)0x0;
  }
  pFVar15 = (FunctionType *)
            llvm::FunctionType::get(pFVar15,auVar41,(long)ppTVar37 - (long)auVar41 >> 3,0);
  llvm::Twine::Twine((Twine *)local_2e0,
                     (string *)((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80));
  (anonymous_namespace)::F =
       llvm::Function::Create(pFVar15,ExternalLinkage,(Twine *)local_2e0,(anonymous_namespace)::M);
  llvm::Twine::Twine((Twine *)local_2e0,"");
  local_50 = (undefined1  [8])
             llvm::BasicBlock::Create
                       ((LLVMContext *)&(anonymous_namespace)::C,(Twine *)local_2e0,
                        (anonymous_namespace)::F,(BasicBlock *)0x0);
  std::vector<llvm::BasicBlock*,std::allocator<llvm::BasicBlock*>>::emplace_back<llvm::BasicBlock*>
            ((vector<llvm::BasicBlock*,std::allocator<llvm::BasicBlock*>> *)
             &(anonymous_namespace)::BBs,(BasicBlock **)local_50);
  pIVar16 = (IRBuilderBase *)operator_new(0x88);
  pBVar21 = (BasicBlock *)*(anonymous_namespace)::BBs;
  pLVar17 = (LLVMContext *)llvm::BasicBlock::getContext(pBVar21);
  (pIVar16->MetadataToCopy).super_SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
  super_SmallVectorBase<unsigned_int>.BeginX =
       &(pIVar16->MetadataToCopy).
        super_SmallVectorStorage<std::pair<unsigned_int,_llvm::MDNode_*>,_2U>;
  pSVar4 = &(pIVar16->MetadataToCopy).
            super_SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_>;
  (pSVar4->super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>).
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
  super_SmallVectorBase<unsigned_int>.Size = 0;
  (pSVar4->super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>).
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
  super_SmallVectorBase<unsigned_int>.Capacity = 2;
  pIVar16->Context = pLVar17;
  pIVar16->Folder = (IRBuilderFolder *)(pIVar16 + 1);
  pIVar16->Inserter =
       (IRBuilderDefaultInserter *)
       &pIVar16[1].MetadataToCopy.super_SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_>.
        super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>.
        super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
        super_SmallVectorBase<unsigned_int>.Size;
  pIVar16->DefaultFPMathTag = (MDNode *)0x0;
  (pIVar16->FMF).Flags = 0;
  pIVar16->IsFPConstrained = false;
  pIVar16->DefaultConstrainedExcept = ebStrict;
  pIVar16->DefaultConstrainedRounding = Dynamic;
  (pIVar16->DefaultOperandBundles).Data = (OperandBundleDefT<llvm::Value_*> *)0x0;
  (pIVar16->DefaultOperandBundles).Length = 0;
  pIVar16[1].MetadataToCopy.super_SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
  super_SmallVectorBase<unsigned_int>.BeginX = &PTR__IRBuilderFolder_00920ca8;
  *(undefined ***)
   &pIVar16[1].MetadataToCopy.super_SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_>.
    super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>.
    super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
    super_SmallVectorBase<unsigned_int>.Size = &PTR__IRBuilderDefaultInserter_00920938;
  pIVar16->BB = pBVar21;
  (pIVar16->InsertPt).NodePtr = (node_pointer)(pBVar21 + 0x28);
  local_50._0_4_ = (anonymous_namespace)::N._128_4_;
  pBVar21 = (BasicBlock *)*(anonymous_namespace)::BBs;
  (anonymous_namespace)::Builder = pIVar16;
  pIVar16->BB = pBVar21;
  (pIVar16->InsertPt).NodePtr = (node_pointer)(pBVar21 + 0x28);
  pFVar44 = (anonymous_namespace)::F;
  if ((anonymous_namespace)::ArgsFromMem[0x80] != '\x01') {
    if (((byte)(anonymous_namespace)::F[0x12] & 1) != 0) {
      llvm::Function::BuildLazyArguments((anonymous_namespace)::F);
    }
    pVVar19 = *(Value **)(pFVar44 + 0x58);
    uVar18 = 0;
    while( true ) {
      pFVar44 = (anonymous_namespace)::F;
      if (((byte)(anonymous_namespace)::F[0x12] & 1) != 0) {
        llvm::Function::BuildLazyArguments((anonymous_namespace)::F);
      }
      if (pVVar19 == (Value *)(*(long *)(pFVar44 + 0x60) * 0x28 + *(long *)(pFVar44 + 0x58)))
      goto LAB_0025f089;
      if ((ulong)((long)-SStr.field_2._8_8_ >> 3) <= uVar18) break;
      auVar51 = llvm::Type::getPrimitiveSizeInBits(*(Type **)(SStr.field_2._8_8_ + uVar18 * 8));
      local_2e0 = auVar51._0_8_;
      VMap.Map.Buckets =
           (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
            *)CONCAT44(VMap.Map.Buckets._4_4_,auVar51._8_4_);
      uVar23 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2e0);
      anon_unknown.dwarf_23be6::addArg(pVVar19,(int)uVar23,ArgsTy_02);
      uVar18 = (ulong)((int)uVar18 + 1);
      pVVar19 = pVVar19 + 0x28;
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00260023:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pFVar44);
LAB_00260034:
    anon_unknown.dwarf_23be6::die("Budget == 0 failed at line __LINE__");
  }
  if (SStr.field_2._8_8_ != 0) {
    uVar39 = 1;
    pFVar44 = (Function *)0x0;
    do {
      pIVar16 = (anonymous_namespace)::Builder;
      if (((Function *)
           ((long)RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl
                  .super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) <= pFVar44) ||
         ((Function *)(DAT_0092f060 - (anonymous_namespace)::globs >> 3) <= pFVar44)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pFVar44);
        goto LAB_0025fffe;
      }
      pTVar20 = *(Type **)((long)(Child *)auStack_a8 + (long)pFVar44 * 8);
      pVVar19 = *(Value **)((anonymous_namespace)::globs + (long)pFVar44 * 8);
      llvm::Twine::Twine((Twine *)local_2e0,"");
      a = llvm::IRBuilderBase::CreateAlignedLoad
                    (pIVar16,pTVar20,pVVar19,(MaybeAlign)0x0,false,(Twine *)local_2e0);
      if ((Function *)((long)-SStr.field_2._8_8_ >> 3) <= pFVar44) goto LAB_00260023;
      auVar51 = llvm::Type::getPrimitiveSizeInBits
                          (*(Type **)(SStr.field_2._8_8_ + (long)pFVar44 * 8));
      local_2e0 = auVar51._0_8_;
      VMap.Map.Buckets =
           (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
            *)CONCAT44(VMap.Map.Buckets._4_4_,auVar51._8_4_);
      uVar18 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2e0);
      anon_unknown.dwarf_23be6::addArg((Value *)a,(int)uVar18,ArgsTy_01);
      pFVar44 = (Function *)(ulong)uVar39;
      uVar39 = uVar39 + 1;
    } while (pFVar44 < (Function *)((long)-SStr.field_2._8_8_ >> 3));
  }
LAB_0025f089:
  iVar10 = 1;
  if ((anonymous_namespace)::Geni1[0x80] == '\0') {
    iVar10 = (anonymous_namespace)::W._128_4_;
  }
  pVVar19 = anon_unknown.dwarf_23be6::genVal((int *)local_50,iVar10,false,false);
  auVar51 = llvm::Type::getPrimitiveSizeInBits(*(Type **)pVVar19);
  local_2e0 = auVar51._0_8_;
  VMap.Map.Buckets =
       (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
        *)CONCAT44(VMap.Map.Buckets._4_4_,auVar51._8_4_);
  uVar18 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2e0);
  pIVar16 = (anonymous_namespace)::Builder;
  if (uVar18 < uVar36) {
    pTVar20 = (Type *)llvm::Type::getIntNTy
                                ((LLVMContext *)&(anonymous_namespace)::C,
                                 (anonymous_namespace)::Promote._128_4_);
    llvm::Twine::Twine((Twine *)local_2e0,"");
    pVVar19 = llvm::IRBuilderBase::CreateCast(pIVar16,ZExt,pVVar19,pTVar20,(Twine *)local_2e0);
  }
  pIVar16 = (anonymous_namespace)::Builder;
  llvm::IRBuilderBase::CreateRet((anonymous_namespace)::Builder,pVVar19);
  puVar6 = DAT_0092f048;
  for (puVar13 = (anonymous_namespace)::Branches; puVar13 != puVar6; puVar13 = puVar13 + 1) {
    pBVar21 = anon_unknown.dwarf_23be6::chooseTarget((BasicBlock *)pIVar16);
    pIVar16 = (IRBuilderBase *)*puVar13;
    llvm::BranchInst::setSuccessor((BranchInst *)pIVar16,0,pBVar21);
    this_01 = (IRBuilderBase *)*puVar13;
    if ((*(uint *)((this_01->MetadataToCopy).
                   super_SmallVectorStorage<std::pair<unsigned_int,_llvm::MDNode_*>,_2U>.InlineElts
                  + 4) & 0x7ffffff) == 3) {
      pBVar21 = anon_unknown.dwarf_23be6::chooseTarget((BasicBlock *)pIVar16);
      llvm::BranchInst::setSuccessor((BranchInst *)this_01,1,pBVar21);
      pIVar16 = this_01;
    }
  }
  pFVar44 = (anonymous_namespace)::F + 0x48;
  pFVar26 = *(Function **)((anonymous_namespace)::F + 0x50);
  pFVar24 = pFVar26;
  if (pFVar26 != pFVar44) {
LAB_0025f1b1:
    do {
      pFVar38 = pFVar26 + -0x18;
      if (pFVar26 == (Function *)0x0) {
        pFVar38 = (Function *)0x0;
      }
      pFVar22 = *(Function **)(pFVar38 + 0x30);
      if (pFVar22 != pFVar38 + 0x28) {
        bVar42 = 0;
        do {
          pFVar46 = pFVar22 + -0x18;
          if (pFVar22 == (Function *)0x0) {
            pFVar46 = (Function *)0x0;
          }
          if (!(bool)(~bVar42 & 1) && pFVar46[0x10] == (Function)0x52) {
            pBVar21 = *(BasicBlock **)(pFVar46 + 0x28);
            llvm::Twine::Twine((Twine *)local_2e0,"phisp");
            llvm::BasicBlock::splitBasicBlock(pBVar21,pFVar46 + 0x18,(Twine *)local_2e0,0);
            pFVar44 = (anonymous_namespace)::F + 0x48;
            pFVar26 = *(Function **)((anonymous_namespace)::F + 0x50);
            pFVar24 = pFVar26;
            if (pFVar26 != pFVar44) goto LAB_0025f1b1;
            goto LAB_0025f24b;
          }
          bVar42 = bVar42 | pFVar46[0x10] != (Function)0x52;
          pFVar22 = *(Function **)(pFVar22 + 8);
        } while (pFVar22 != pFVar38 + 0x28);
      }
      pFVar26 = *(Function **)(pFVar26 + 8);
    } while (pFVar26 != pFVar44);
  }
LAB_0025f24b:
  pFVar44 = (anonymous_namespace)::F + 0x48;
  pFVar26 = pFVar24;
  if (pFVar24 == pFVar44) {
    pFVar38 = (Function *)0x0;
  }
  else {
    pFVar22 = pFVar24 + -0x18;
    if (pFVar24 == (Function *)0x0) {
      pFVar22 = (Function *)0x0;
    }
    pFVar38 = *(Function **)(pFVar22 + 0x30);
    if (pFVar38 == pFVar22 + 0x28) {
      for (pFVar26 = *(Function **)(pFVar24 + 8); pFVar26 != pFVar44;
          pFVar26 = *(Function **)(pFVar26 + 8)) {
        pFVar22 = pFVar26 + -0x18;
        if (pFVar26 == (Function *)0x0) {
          pFVar22 = (Function *)0x0;
        }
        pFVar38 = *(Function **)(pFVar22 + 0x30);
        if (pFVar38 != pFVar22 + 0x28) break;
      }
    }
  }
  if (pFVar26 != pFVar44) {
    do {
      if (pFVar38 == (Function *)0x0) goto LAB_0025fffe;
      if (pFVar38[-8] == (Function)0x52) {
        lVar40 = *(long *)(pFVar38 + 0x10);
        llvm::Value::assertModuleIsMaterializedImpl();
        for (lVar40 = *(long *)(lVar40 + 8); lVar40 != 0; lVar40 = *(long *)(lVar40 + 8)) {
          lVar45 = *(long *)(lVar40 + 0x18);
          if (lVar45 == 0) goto LAB_0025ffbb;
          if (*(byte *)(lVar45 + 0x10) - 0x1c < 0xb && 0x1a < *(byte *)(lVar45 + 0x10))
          goto LAB_0025f440;
        }
      }
LAB_0025f44b:
      pFVar38 = *(Function **)(pFVar38 + 8);
      pFVar24 = pFVar26 + -0x18;
      if (pFVar26 == (Function *)0x0) {
        pFVar24 = (Function *)0x0;
      }
      if (pFVar38 == pFVar24 + 0x28) {
        for (pFVar26 = *(Function **)(pFVar26 + 8); pFVar26 != pFVar44;
            pFVar26 = *(Function **)(pFVar26 + 8)) {
          pFVar24 = pFVar26 + -0x18;
          if (pFVar26 == (Function *)0x0) {
            pFVar24 = (Function *)0x0;
          }
          pFVar38 = *(Function **)(pFVar24 + 0x30);
          if (pFVar38 != pFVar24 + 0x28) break;
        }
      }
    } while (pFVar26 != pFVar44);
    pFVar24 = *(Function **)((anonymous_namespace)::F + 0x50);
  }
  pFVar44 = (anonymous_namespace)::F + 0x48;
  if (pFVar24 != pFVar44) {
    bVar9 = true;
    do {
      pFVar26 = pFVar24 + -0x18;
      if (pFVar24 == (Function *)0x0) {
        pFVar26 = (Function *)0x0;
      }
      if (!bVar9) {
        llvm::Value::assertModuleIsMaterializedImpl();
        lVar40 = *(long *)(pFVar26 + 8);
        do {
          if (lVar40 == 0) {
            exit(0);
          }
          if (*(long *)(lVar40 + 0x18) == 0) goto LAB_0025ffbb;
          bVar42 = *(byte *)(*(long *)(lVar40 + 0x18) + 0x10);
          lVar40 = *(long *)(lVar40 + 8);
        } while (10 < bVar42 - 0x1c || bVar42 < 0x1b);
        for (; lVar40 != 0; lVar40 = *(long *)(lVar40 + 8)) {
          if (*(long *)(lVar40 + 0x18) == 0) goto LAB_0025ffbb;
        }
      }
      pFVar24 = *(Function **)(pFVar24 + 8);
      bVar9 = false;
    } while (pFVar24 != pFVar44);
  }
  if (auStack_a8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_a8,
                    (long)RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_a8);
  }
  if (SStr.field_2._8_8_ != 0) {
    operator_delete((void *)SStr.field_2._8_8_,-SStr.field_2._8_8_);
  }
  local_158 = (undefined1  [8])&SStr._M_string_length;
  SStr._M_dataplus._M_p = (pointer)0x0;
  SStr._M_string_length._0_1_ = 0;
  llvm::raw_string_ostream::raw_string_ostream
            ((raw_string_ostream *)(SStr.field_2._M_local_buf + 8),(string *)local_158);
  llvm::legacy::PassManager::PassManager((PassManager *)p);
  if ((anonymous_namespace)::RemoveUnusedArgs[0x80] == '\x01') {
    pppFStack_78 = (pointer *)0x0;
    Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pMVar14 = *(Module **)((anonymous_namespace)::M + 0x20);
    pMVar47 = (anonymous_namespace)::M + 0x18;
    if (pMVar14 != pMVar47) {
      do {
        pTVar25 = (Twine *)(pMVar14 + -0x38);
        if (pMVar14 == (Module *)0x0) {
          pTVar25 = (Twine *)0x0;
        }
        if ((pTVar25[2].RHS.twine != (Twine *)0x0) && ((pTVar25->RHSKind & 0x20) == NullKind)) {
          local_2e0 = (undefined1  [8])pTVar25;
          std::vector<llvm::Function*,std::allocator<llvm::Function*>>::
          emplace_back<llvm::Function*>
                    ((vector<llvm::Function*,std::allocator<llvm::Function*>> *)&pppFStack_78,
                     (Function **)local_2e0);
        }
        ppFVar7 = Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar14 = *(Module **)(pMVar14 + 8);
      } while (pMVar14 != pMVar47);
      if ((pointer)pppFStack_78 !=
          Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        ppFVar43 = (pointer)pppFStack_78;
        do {
          pFVar44 = *ppFVar43;
          VMap.Map.NumEntries = 0x80;
          local_2e0 = (undefined1  [8])llvm::allocate_buffer(0x2000,8);
          llvm::
          DenseMapBase<llvm::DenseMap<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>,_llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>
          ::initEmpty((DenseMapBase<llvm::DenseMap<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>,_llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>
                       *)local_2e0);
          VMap.Map.NumBuckets._0_1_ = 0;
          VMap.MDMap.Storage.field_0.field2[0x10] = 0;
          auStack_e8 = (undefined1  [8])0x0;
          InstToDelete.super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          InstToDelete.super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          iVar49 = llvm::Function::args(pFVar44);
          for (pTVar25 = (Twine *)iVar49.begin_iterator; pTVar25 != (Twine *)iVar49.end_iterator;
              pTVar25 = pTVar25 + 1) {
            iVar10 = llvm::Value::getNumUses((Value *)pTVar25);
            if (iVar10 == 0) {
              pVVar19 = (Value *)llvm::UndefValue::get((Type *)(pTVar25->LHS).twine);
              auStack_a8 = (undefined1  [8])pTVar25;
              this_00 = &llvm::
                         ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                         ::operator[]((ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                                       *)local_2e0,(Value **)auStack_a8)->super_ValueHandleBase;
              llvm::ValueHandleBase::operator=(this_00,pVVar19);
            }
          }
          if ((int)VMap.Map.Buckets != 0) {
            pFVar26 = (Function *)
                      llvm::CloneFunction(pFVar44,(ValueMap *)local_2e0,(ClonedCodeInfo *)0x0);
            llvm::Function::removeFromParent(pFVar26);
            this = (SymbolTableListTraits<llvm::Function> *)((anonymous_namespace)::M + 0x18);
            pSVar27 = (SymbolTableListTraits<llvm::Function> *)(pFVar44 + 0x38);
            if (*(SymbolTableListTraits<llvm::Function> **)((anonymous_namespace)::M + 0x18) == this
               ) {
              pSVar27 = this;
            }
            plVar30 = *(long **)(pSVar27 + 8);
            llvm::SymbolTableListTraits<llvm::Function>::addNodeToList(this,pFVar26);
            lVar40 = *plVar30;
            *(long **)(pFVar26 + 0x40) = plVar30;
            *(long *)(pFVar26 + 0x38) = lVar40;
            *(Function **)(lVar40 + 8) = pFVar26 + 0x38;
            *plVar30 = (long)(pFVar26 + 0x38);
            auVar50 = llvm::Value::getName((Value *)pFVar44);
            local_50 = (undefined1  [8])&local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,auVar50._0_8_,auVar50._8_8_ + auVar50._0_8_);
            llvm::Function::eraseFromParent();
            llvm::Twine::Twine((Twine *)auStack_a8,(string *)local_50);
            llvm::Value::setName((Value *)pFVar26,(Twine *)auStack_a8);
            if (local_50 != (undefined1  [8])&local_40) {
              operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
            }
          }
          std::vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>::~vector
                    ((vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_> *)auStack_e8);
          if (VMap.MDMap.Storage.field_0.field2[0x10] == '\x01') {
            llvm::
            DenseMap<const_llvm::Metadata_*,_llvm::TrackingMDRef,_llvm::DenseMapInfo<const_llvm::Metadata_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Metadata_*,_llvm::TrackingMDRef>_>
            ::~DenseMap((DenseMap<const_llvm::Metadata_*,_llvm::TrackingMDRef,_llvm::DenseMapInfo<const_llvm::Metadata_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Metadata_*,_llvm::TrackingMDRef>_>
                         *)&VMap.Map.NumBuckets);
            VMap.MDMap.Storage.field_0.field2[0x10] = 0;
          }
          llvm::
          DenseMap<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>
          ::~DenseMap((DenseMap<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>
                       *)local_2e0);
          ppFVar43 = ppFVar43 + 1;
        } while (ppFVar43 != ppFVar7);
      }
      if ((pointer)pppFStack_78 != (pointer)0x0) {
        operator_delete(pppFStack_78,
                        (long)Funcs.
                              super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pppFStack_78);
      }
    }
  }
  if ((anonymous_namespace)::Verify[0x80] == '\x01') {
    pPVar28 = (Pass *)llvm::createVerifierPass(true);
    llvm::legacy::PassManager::add((PassManager *)p,pPVar28);
  }
  puVar2 = &VMap.Map.NumEntries;
  VMap.Map.Buckets =
       (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
        *)0x0;
  VMap.Map.NumEntries = VMap.Map.NumEntries & 0xffffff00;
  local_2e0 = (undefined1  [8])puVar2;
  pPVar28 = (Pass *)llvm::createPrintModulePass
                              ((raw_ostream *)(SStr.field_2._M_local_buf + 8),(string *)local_2e0,
                               false);
  llvm::legacy::PassManager::add((PassManager *)p,pPVar28);
  if (local_2e0 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_2e0,CONCAT44(VMap.Map.NumTombstones,VMap.Map.NumEntries) + 1);
  }
  llvm::legacy::PassManager::run((PassManager *)p,(anonymous_namespace)::M);
  auStack_a8 = (undefined1  [8])
               &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char*>((string *)auStack_a8,*local_f8,local_f8[1] + *local_f8);
  if ((anonymous_namespace)::OneFuncPerFile[0x80] == '\x01') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2e0);
    poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&VMap.Map.NumEntries,
                         (char *)(anonymous_namespace)::BaseName_abi_cxx11_._128_8_,
                         (anonymous_namespace)::BaseName_abi_cxx11_._136_8_);
    uVar18 = -(anonymous_namespace)::Id;
    if (0 < (long)(anonymous_namespace)::Id) {
      uVar18 = (anonymous_namespace)::Id;
    }
    uVar39 = 1;
    if (9 < uVar18) {
      uVar23 = uVar18;
      uVar36 = 4;
      do {
        uVar39 = uVar36;
        if (uVar23 < 100) {
          uVar39 = uVar39 - 2;
          goto LAB_0025f9fc;
        }
        if (uVar23 < 1000) {
          uVar39 = uVar39 - 1;
          goto LAB_0025f9fc;
        }
        if (uVar23 < 10000) goto LAB_0025f9fc;
        bVar9 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        uVar36 = uVar39 + 4;
      } while (bVar9);
      uVar39 = uVar39 + 1;
    }
LAB_0025f9fc:
    lVar40 = (long)(anonymous_namespace)::Id >> 0x3f;
    local_50 = (undefined1  [8])&local_40;
    std::__cxx11::string::_M_construct
              ((ulong)local_50,(char)uVar39 - (char)((long)(anonymous_namespace)::Id >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_50 + -lVar40),uVar39,uVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar29,(char *)local_50,_Budget);
    if (local_50 != (undefined1  [8])&local_40) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    uVar18 = std::__cxx11::string::find
                       (auStack_a8,(anonymous_namespace)::BaseName_abi_cxx11_._128_8_,0);
    std::__cxx11::string::replace
              ((ulong)auStack_a8,uVar18,(char *)(anonymous_namespace)::BaseName_abi_cxx11_._136_8_,
               0x776909);
    uVar18 = -(anonymous_namespace)::Id;
    if (0 < (long)(anonymous_namespace)::Id) {
      uVar18 = (anonymous_namespace)::Id;
    }
    uVar39 = 1;
    if (9 < uVar18) {
      uVar23 = uVar18;
      uVar36 = 4;
      do {
        uVar39 = uVar36;
        if (uVar23 < 100) {
          uVar39 = uVar39 - 2;
          goto LAB_0025fc4c;
        }
        if (uVar23 < 1000) {
          uVar39 = uVar39 - 1;
          goto LAB_0025fc4c;
        }
        if (uVar23 < 10000) goto LAB_0025fc4c;
        bVar9 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        uVar36 = uVar39 + 4;
      } while (bVar9);
      uVar39 = uVar39 + 1;
    }
LAB_0025fc4c:
    lVar40 = (long)(anonymous_namespace)::Id >> 0x3f;
    ppWVar3 = &InstToDelete.super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>._M_impl.
               super__Vector_impl_data._M_finish;
    auStack_e8 = (undefined1  [8])ppWVar3;
    std::__cxx11::string::_M_construct
              ((ulong)auStack_e8,(char)uVar39 - (char)((long)(anonymous_namespace)::Id >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)auStack_e8 + -lVar40),uVar39,uVar18);
    plVar30 = (long *)std::__cxx11::string::replace
                                ((ulong)auStack_e8,0,(char *)0x0,
                                 (anonymous_namespace)::BaseName_abi_cxx11_._128_8_);
    pppFVar1 = &Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    plVar33 = plVar30 + 2;
    if ((pointer *)*plVar30 == (pointer *)plVar33) {
      Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)*plVar33;
      Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)plVar30[3];
      pppFStack_78 = pppFVar1;
    }
    else {
      Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)*plVar33;
      pppFStack_78 = (pointer *)*plVar30;
    }
    Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)plVar30[1];
    *plVar30 = (long)plVar33;
    plVar30[1] = 0;
    *(undefined1 *)(plVar30 + 2) = 0;
    plVar30 = (long *)std::__cxx11::string::append((char *)&pppFStack_78);
    paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar30 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar30 == paVar34) {
      local_40._M_allocated_capacity = paVar34->_M_allocated_capacity;
      local_40._8_8_ = plVar30[3];
      local_50 = (undefined1  [8])&local_40;
    }
    else {
      local_40._M_allocated_capacity = paVar34->_M_allocated_capacity;
      local_50 = (undefined1  [8])*plVar30;
    }
    _Budget = plVar30[1];
    *plVar30 = (long)paVar34;
    plVar30[1] = 0;
    *(undefined1 *)(plVar30 + 2) = 0;
    if (pppFStack_78 != pppFVar1) {
      operator_delete(pppFStack_78,
                      (long)Funcs.
                            super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1);
    }
    if (auStack_e8 != (undefined1  [8])ppWVar3) {
      operator_delete((void *)auStack_e8,
                      (ulong)(InstToDelete.
                              super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
    }
    iVar10 = open((char *)local_50,0xc2,0x180);
    if (local_50 == (undefined1  [8])&local_40) goto LAB_0025fd98;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2e0);
    poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&VMap.Map.NumEntries,
                         (char *)(anonymous_namespace)::BaseName_abi_cxx11_._128_8_,
                         (anonymous_namespace)::BaseName_abi_cxx11_._136_8_);
    uVar18 = -(anonymous_namespace)::Id;
    if (0 < (long)(anonymous_namespace)::Id) {
      uVar18 = (anonymous_namespace)::Id;
    }
    uVar39 = 1;
    if (9 < uVar18) {
      uVar23 = uVar18;
      uVar36 = 4;
      do {
        uVar39 = uVar36;
        if (uVar23 < 100) {
          uVar39 = uVar39 - 2;
          goto LAB_0025fb16;
        }
        if (uVar23 < 1000) {
          uVar39 = uVar39 - 1;
          goto LAB_0025fb16;
        }
        if (uVar23 < 10000) goto LAB_0025fb16;
        bVar9 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        uVar36 = uVar39 + 4;
      } while (bVar9);
      uVar39 = uVar39 + 1;
    }
LAB_0025fb16:
    lVar40 = (long)(anonymous_namespace)::Id >> 0x3f;
    local_50 = (undefined1  [8])&local_40;
    std::__cxx11::string::_M_construct
              ((ulong)local_50,(char)uVar39 - (char)((long)(anonymous_namespace)::Id >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_50 + -lVar40),uVar39,uVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar29,(char *)local_50,_Budget);
    if (local_50 != (undefined1  [8])&local_40) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    uVar18 = std::__cxx11::string::find
                       (auStack_a8,(anonymous_namespace)::BaseName_abi_cxx11_._128_8_,0);
    uVar5 = (anonymous_namespace)::BaseName_abi_cxx11_._136_8_;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)auStack_a8,uVar18,(char *)uVar5,(ulong)local_50);
    if (local_50 != (undefined1  [8])&local_40) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    iVar10 = rand();
    uVar36 = (uint)((long)iVar10 % (long)(int)(anonymous_namespace)::NumFiles._128_4_);
    uVar39 = -uVar36;
    if (0 < (int)uVar36) {
      uVar39 = uVar36;
    }
    __len = 1;
    if (9 < uVar39) {
      uVar18 = (ulong)uVar39;
      uVar8 = 4;
      do {
        __len = uVar8;
        uVar32 = (uint)uVar18;
        if (uVar32 < 100) {
          __len = __len - 2;
          goto LAB_0025fef8;
        }
        if (uVar32 < 1000) {
          __len = __len - 1;
          goto LAB_0025fef8;
        }
        if (uVar32 < 10000) goto LAB_0025fef8;
        uVar18 = uVar18 / 10000;
        uVar8 = __len + 4;
      } while (99999 < uVar32);
      __len = __len + 1;
    }
LAB_0025fef8:
    pppFVar1 = &Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    pppFStack_78 = pppFVar1;
    std::__cxx11::string::_M_construct
              ((ulong)&pppFStack_78,
               (char)__len -
               ((char)((ulong)((long)iVar10 % (long)(int)(anonymous_namespace)::NumFiles._128_4_) >>
                      0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar36 >> 0x1f) + (long)pppFStack_78),__len,uVar39);
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&pppFStack_78);
    paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 == paVar34) {
      local_40._M_allocated_capacity = paVar34->_M_allocated_capacity;
      local_40._8_8_ = puVar13[3];
      local_50 = (undefined1  [8])&local_40;
    }
    else {
      local_40._M_allocated_capacity = paVar34->_M_allocated_capacity;
      local_50 = (undefined1  [8])*puVar13;
    }
    _Budget = puVar13[1];
    *puVar13 = paVar34;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    if (pppFStack_78 != pppFVar1) {
      operator_delete(pppFStack_78,
                      (long)Funcs.
                            super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1);
    }
    iVar10 = open((char *)local_50,0x442,0x180);
    if (local_50 == (undefined1  [8])&local_40) goto LAB_0025fd98;
  }
  operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
LAB_0025fd98:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_2e0);
  std::ios_base::~ios_base(local_260);
  if (iVar10 < 2) {
    anon_unknown.dwarf_23be6::die("open failed");
  }
  uVar18 = write(iVar10,(void *)auStack_a8,
                 (size_t)RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if ((pointer)(uVar18 & 0xffffffff) ==
      RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar10 = close(iVar10);
    if (iVar10 == 0) {
      if (auStack_a8 !=
          (undefined1  [8])
          &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((void *)auStack_a8,
                        (long)RealArgsTy.
                              super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1);
      }
      llvm::legacy::PassManager::~PassManager((PassManager *)p);
      llvm::raw_ostream::~raw_ostream((raw_ostream *)(SStr.field_2._M_local_buf + 8));
      if (local_158 != (undefined1  [8])&SStr._M_string_length) {
        operator_delete((void *)local_158,
                        CONCAT71(SStr._M_string_length._1_7_,(undefined1)SStr._M_string_length) + 1)
        ;
      }
      _Var12 = getpid();
      if (_Var12 == _Var11) {
        close(local_c4);
        read(local_c8,local_2e0,1);
        lVar40 = 0;
        do {
          if (*(int *)((long)(anonymous_namespace)::Shmem + lVar40 * 4 + 0x12f8) != 0) {
            prVar31 = (raw_ostream *)llvm::errs();
            Str.Length = 0x25;
            Str.Data = "oops, there are waiting processes at ";
            prVar31 = llvm::raw_ostream::operator<<(prVar31,Str);
            prVar31 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar31,lVar40);
            Str_00.Length = 1;
            Str_00.Data = "\n";
            llvm::raw_ostream::operator<<(prVar31,Str_00);
          }
          lVar40 = lVar40 + 1;
        } while (lVar40 != 100);
      }
      llvm::PrettyStackTraceEntry::~PrettyStackTraceEntry
                ((PrettyStackTraceEntry *)&stack0xfffffffffffffd00);
      return 0;
    }
    pcVar35 = "res == 0 failed at line __LINE__";
  }
  else {
    pcVar35 = "non-atomic write";
  }
  anon_unknown.dwarf_23be6::die(pcVar35);
LAB_0025fffe:
  pcVar35 = 
  "static bool llvm::isa_impl_cl<llvm::PHINode, const llvm::Instruction *>::doit(const From *) [To = llvm::PHINode, From = const llvm::Instruction *]"
  ;
  goto LAB_0025ffd0;
LAB_0025f440:
  while (local_50._0_4_ == 0) {
    pBVar21 = *(BasicBlock **)(lVar45 + 0x28);
    auVar51 = llvm::Type::getPrimitiveSizeInBits(*(Type **)(pFVar38 + -0x18));
    local_2e0 = auVar51._0_8_;
    VMap.Map.Buckets =
         (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
          *)CONCAT44(VMap.Map.Buckets._4_4_,auVar51._8_4_);
    uVar18 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2e0);
    pVVar19 = anon_unknown.dwarf_23be6::genVal((int *)local_50,(int)uVar18,true,false);
    llvm::PHINode::addIncoming((PHINode *)(pFVar38 + -0x18),pVVar19,pBVar21);
    do {
      lVar40 = *(long *)(lVar40 + 8);
      if (lVar40 == 0) goto LAB_0025f44b;
      lVar45 = *(long *)(lVar40 + 0x18);
      if (lVar45 == 0) goto LAB_0025ffbb;
    } while (*(byte *)(lVar45 + 0x10) < 0x1b || 10 < *(byte *)(lVar45 + 0x10) - 0x1c);
  }
  goto LAB_00260034;
LAB_0025ffbb:
  pcVar35 = 
  "static bool llvm::isa_impl_cl<llvm::Instruction, const llvm::User *>::doit(const From *) [To = llvm::Instruction, From = const llvm::User *]"
  ;
LAB_0025ffd0:
  __assert_fail("Val && \"isa<> used on a null pointer\"",
                "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x68,pcVar35);
}

Assistant:

int main(int argc, char **argv) {
  PrettyStackTraceProgram X(argc, argv);
  cl::ParseCommandLineOptions(argc, argv, "llvm codegen stress-tester\n");

  if (W < 2)
    die("Width must be >= 2");

  Shmem =
      (struct shared *)::mmap(0, sizeof(struct shared), PROT_READ | PROT_WRITE,
                              MAP_SHARED | MAP_ANON, -1, 0);
  if (Shmem == MAP_FAILED)
    die("mmap failed");
  Shmem->NextId = 1;
  Shmem->Running = 1;
  if (pthread_mutexattr_init(&Shmem->LockAttr) != 0)
    die("pthread_mutexattr_init failed");
  if (pthread_mutexattr_setpshared(&Shmem->LockAttr, PTHREAD_PROCESS_SHARED) !=
      0)
    die("pthread_mutexattr_setpshared failed");
  if (pthread_mutex_init(&Shmem->Lock, &Shmem->LockAttr) != 0)
    die("pthread_mutex_init failed");
  if (pthread_condattr_init(&Shmem->CondAttr) != 0)
    die("pthread_condattr_init failed");
  if (pthread_condattr_setpshared(&Shmem->CondAttr, PTHREAD_PROCESS_SHARED) !=
      0)
    die("pthread_condattr_setpshared failed");
  for (int i = 0; i < MAX_DEPTH; ++i) {
    if (pthread_cond_init(&Shmem->Cond[i], &Shmem->CondAttr) != 0)
      die("pthread_cond_init failed");
    Shmem->Waiting[i] = 0;
  }
  Init = 1;

  int p[2];
  pid_t original_pid = ::getpid();
  if (::atexit(decrease_runners) != 0)
    die("atexit failed");
  /*
   * use a trick from stackoverflow to work around the fact that in
   * UNIX we can only wait on our children, not our extended
   * descendents: all descendents are going to inherit this pipe,
   * implicitly closing its fds when they terminate. at that point
   * reading from the pipe will not block but rather return with EOF
   */
  if (::pipe(p) != 0)
    die("pipe failed??");

  generate();
  output();

  if (::getpid() == original_pid) {
    char buf[1];
    ::close(p[1]);
    ::read(p[0], buf, 1);
    for (int i = 0; i < MAX_DEPTH; i++) {
      if (Shmem->Waiting[i] != 0)
        errs() << "oops, there are waiting processes at " << i << "\n";
    }
  }

  return 0;
}